

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O1

void duckdb::DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::TableFunction,_true> *this;
  vector<duckdb::TableFunction,_true> *this_00;
  TableFunctionSet functions;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_288;
  TableFunctionSet local_268;
  string local_230;
  TableFunctionSet local_210;
  TableFunction local_1d8;
  
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"duckdb_extensions","");
  TableFunctionSet::TableFunctionSet(&local_210,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  local_288.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1d8,(vector<duckdb::LogicalType,_true> *)&local_288,DuckDBExtensionsFunction,
             DuckDBExtensionsBind,DuckDBExtensionsInit,(table_function_init_local_t)0x0);
  this_00 = &local_210.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1d8);
  local_1d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0247c898;
  if (local_1d8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d8.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_288);
  paVar1 = &local_268.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_268.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,
             local_210.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p,
             local_210.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p +
             local_210.super_FunctionSet<duckdb::TableFunction>.name._M_string_length);
  this = &local_268.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  BuiltinFunctions::AddFunction(set,&local_268);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_268.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_210.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_210.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet functions("duckdb_extensions");
	functions.AddFunction(TableFunction({}, DuckDBExtensionsFunction, DuckDBExtensionsBind, DuckDBExtensionsInit));
	set.AddFunction(functions);
}